

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_clusterizer.h
# Opt level: O2

void __thiscall
crnlib::clusterizer<crnlib::vec<2U,_float>_>::add_training_vec
          (clusterizer<crnlib::vec<2U,_float>_> *this,vec<2U,_float> *v,uint weight)

{
  pair<crnlib::vec<2U,_float>,_unsigned_int> local_24;
  
  vec<2U,_float>::vec(&local_24.first,v);
  local_24.second = weight;
  vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_>::push_back
            (&this->m_training_vecs,&local_24);
  return;
}

Assistant:

void add_training_vec(const VectorType& v, uint weight) {
    m_training_vecs.push_back(std::make_pair(v, weight));
  }